

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O0

void anurbs::NurbsCurveGeometry<3L>::save(Model *model,Type *data,Json *target)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_198;
  allocator<char> local_169;
  string local_168;
  Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> local_148;
  allocator<char> local_109;
  string local_108;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_e8;
  allocator<char> local_b9;
  string local_b8;
  Index local_98;
  allocator<char> local_89;
  string local_88;
  long local_68 [3];
  allocator<char> local_49;
  string local_48;
  DataWriter local_28;
  DataWriter writer;
  Json *target_local;
  Type *data_local;
  Model *model_local;
  
  writer.m_data = target;
  DataWriter::DataWriter(&local_28,target);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"degree",&local_49);
  iVar2 = (*(data->super_CurveBase<3L>)._vptr_CurveBase[2])();
  local_68[0] = CONCAT44(extraout_var,iVar2);
  DataWriter::write<long>(&local_28,&local_48,local_68);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"nb_poles",&local_89);
  local_98 = nb_poles(data);
  DataWriter::write<long>(&local_28,&local_88,&local_98);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b8,"knots",&local_b9);
  knots(&local_e8,data);
  DataWriter::
  write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
            (&local_28,&local_b8,&local_e8);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
            (&local_e8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"poles",&local_109);
  poles(&local_148,data);
  DataWriter::
  write_matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            (&local_28,&local_108,&local_148);
  Eigen::Ref<const_Eigen::Matrix<double,_-1,_3,_1,_-1,_3>,_0,_Eigen::OuterStride<-1>_>::~Ref
            (&local_148);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator(&local_109);
  bVar1 = is_rational(data);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_168,"weights",&local_169);
    weights(&local_198,data);
    DataWriter::
    write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
              (&local_28,&local_168,&local_198);
    Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>::~Ref
              (&local_198);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator(&local_169);
  }
  return;
}

Assistant:

static void save(const Model& model, const Type& data, Json& target)
    {
        DataWriter writer(target);

        writer.write("degree", data.degree());
        writer.write("nb_poles", data.nb_poles());
        writer.write_vector("knots", data.knots());
        writer.write_matrix("poles", data.poles());

        if (data.is_rational()) {
            writer.write_vector("weights", data.weights());
        }
    }